

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

prf_node_t * prf_node_clone(prf_node_t *node,prf_model_t *source,prf_model_t *target)

{
  byte *pbVar1;
  pool_t pool_id;
  undefined8 uVar2;
  prf_nodeinfo_t *ppVar3;
  prf_node_t *ppVar4;
  uint8_t *puVar5;
  
  ppVar3 = prf_nodeinfo_get(node->opcode);
  if ((ppVar3 != (prf_nodeinfo_t *)0x0) &&
     (ppVar3->clone_f != (_func_prf_node_t_ptr_prf_node_t_ptr_prf_model_t_ptr_prf_model_t_ptr *)0x0)
     ) {
    ppVar4 = (*ppVar3->clone_f)(node,source,target);
    return ppVar4;
  }
  if (target->mempool_id == 0) {
    ppVar4 = prf_node_create();
    if (ppVar4 == (prf_node_t *)0x0) goto LAB_00103d79;
  }
  else {
    ppVar4 = (prf_node_t *)pool_malloc(target->mempool_id,0x28);
    if (ppVar4 == (prf_node_t *)0x0) {
LAB_00103d79:
      prf_error(9,"memory allocation failure (returned NULL)");
      return (prf_node_t *)0x0;
    }
    ppVar4->opcode = 0;
    ppVar4->length = 4;
    *(undefined8 *)&ppVar4->flags = 0;
    *(undefined8 *)((long)&ppVar4->data + 4) = 0;
    *(undefined8 *)((long)&ppVar4->children + 4) = 0;
    *(undefined8 *)((long)&ppVar4->parent + 4) = 0;
    *(undefined4 *)((long)&ppVar4->userdata + 4) = 0;
  }
  uVar2._0_2_ = node->opcode;
  uVar2._2_2_ = node->length;
  uVar2._4_4_ = node->flags;
  ppVar4->opcode = (short)(int)uVar2;
  ppVar4->length = (short)((uint)(int)uVar2 >> 0x10);
  pool_id = target->mempool_id;
  if (pool_id == 0) {
    if (uVar2._2_2_ < 5) goto LAB_00103dad;
    puVar5 = (uint8_t *)malloc((ulong)(uVar2._2_2_ - 4));
    ppVar4->data = puVar5;
  }
  else {
    pbVar1 = (byte *)((long)&ppVar4->flags + 1);
    *pbVar1 = *pbVar1 | 1;
    if (uVar2._2_2_ < 5) goto LAB_00103dad;
    puVar5 = (uint8_t *)pool_malloc(pool_id,uVar2._2_2_ - 4);
    ppVar4->data = puVar5;
    uVar2._2_2_ = node->length;
    if (uVar2._2_2_ < 5) goto LAB_00103dad;
  }
  if (puVar5 == (uint8_t *)0x0) {
    prf_error(9,"memory allocation failure (returned NULL)");
    if (target->mempool_id == 0) {
      free(ppVar4);
    }
    return (prf_node_t *)0x0;
  }
LAB_00103dad:
  memcpy(ppVar4->data,node->data,(ulong)uVar2._2_2_ - 4);
  return ppVar4;
}

Assistant:

prf_node_t *
prf_node_clone(
    prf_node_t * node,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_nodeinfo_t * info;

    assert( node != NULL && target != NULL );

    info = prf_nodeinfo_get( node->opcode );
    if ( info != NULL && info->clone_f != NULL ) {
        return (*(info->clone_f))( node, source, target );
    } else {
        prf_node_t * newnode;
        if ( target->mempool_id == 0 ) {
            newnode = prf_node_create();
        } else {
            newnode = (prf_node_t *)pool_malloc( target->mempool_id, 
						 sizeof( prf_node_t ) );
            prf_node_clear( newnode );
        }
        if ( newnode == NULL ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            return NULL;
        }
        newnode->opcode = node->opcode;
        newnode->length = node->length;
        if ( target->mempool_id != 0 )
            newnode->flags |= PRF_NODE_MEMPOOLED;
        if ( (node->length > 4) && (target->mempool_id == 0) )
            newnode->data = (uint8_t *)malloc( node->length - 4 );
        else if ( node->length > 4 )
            newnode->data = (uint8_t *)pool_malloc( target->mempool_id, 
						    node->length - 4 );
        if ( (node->length > 4) && (newnode->data == NULL) ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            if ( target->mempool_id == 0 )
                free( newnode );
            return NULL;
        }
        memcpy( newnode->data, node->data, node->length - 4 );
        return newnode;
    }
}